

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_binding.cpp
# Opt level: O0

ColumnBinding __thiscall
duckdb::TableBinding::GetColumnBinding(TableBinding *this,column_t column_index)

{
  pointer this_00;
  ColumnBinding CVar1;
  unsigned_long *puVar2;
  reference this_01;
  idx_t iVar3;
  unsigned_long *puVar4;
  idx_t in_RSI;
  vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *in_RDI;
  value_type *col_id;
  idx_t i;
  vector<duckdb::ColumnIndex,_true> *column_ids;
  ColumnBinding binding;
  size_type in_stack_ffffffffffffffa8;
  vector<duckdb::ColumnIndex,_true> *in_stack_ffffffffffffffb0;
  unsigned_long *__args;
  unsigned_long *local_30;
  ColumnBinding local_10;
  
  this_00 = in_RDI[9].super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  ColumnBinding::ColumnBinding(&local_10);
  local_10.column_index =
       ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::size
                 ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)this_00);
  local_30 = (unsigned_long *)0x0;
  do {
    __args = local_30;
    puVar2 = (unsigned_long *)
             ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::size
                       ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)this_00
                       );
    if (puVar2 <= __args) {
LAB_00e7239a:
      puVar2 = (unsigned_long *)local_10.column_index;
      puVar4 = (unsigned_long *)
               ::std::vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>::size
                         ((vector<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_> *)
                          this_00);
      if (puVar2 == puVar4) {
        ::std::vector<duckdb::ColumnIndex,std::allocator<duckdb::ColumnIndex>>::
        emplace_back<unsigned_long&>(in_RDI,__args);
      }
      CVar1.column_index = local_10.column_index;
      CVar1.table_index =
           (idx_t)in_RDI[4].
                  super__Vector_base<duckdb::ColumnIndex,_std::allocator<duckdb::ColumnIndex>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
      return CVar1;
    }
    this_01 = vector<duckdb::ColumnIndex,_true>::operator[]
                        (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    iVar3 = ColumnIndex::GetPrimaryIndex(this_01);
    if (iVar3 == in_RSI) {
      local_10.column_index = (idx_t)local_30;
      goto LAB_00e7239a;
    }
    local_30 = (unsigned_long *)((long)local_30 + 1);
  } while( true );
}

Assistant:

ColumnBinding TableBinding::GetColumnBinding(column_t column_index) {
	auto &column_ids = bound_column_ids;
	ColumnBinding binding;

	// Locate the column_id that matches the 'column_index'
	binding.column_index = column_ids.size();
	for (idx_t i = 0; i < column_ids.size(); ++i) {
		auto &col_id = column_ids[i];
		if (col_id.GetPrimaryIndex() == column_index) {
			binding.column_index = i;
			break;
		}
	}
	// If it wasn't found, add it
	if (binding.column_index == column_ids.size()) {
		column_ids.emplace_back(column_index);
	}

	binding.table_index = index;
	return binding;
}